

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

htmlEntityDesc * htmlParseEntityRef(htmlParserCtxtPtr ctxt,xmlChar **str)

{
  xmlChar *name_00;
  htmlParserCtxtPtr local_30;
  htmlEntityDesc *ent;
  xmlChar *name;
  xmlChar **str_local;
  htmlParserCtxtPtr ctxt_local;
  
  local_30 = (htmlParserCtxtPtr)0x0;
  if (str != (xmlChar **)0x0) {
    *str = (xmlChar *)0x0;
  }
  if ((ctxt == (htmlParserCtxtPtr)0x0) || (ctxt->input == (xmlParserInputPtr)0x0)) {
    ctxt_local = (htmlParserCtxtPtr)0x0;
  }
  else {
    if (*ctxt->input->cur == '&') {
      xmlNextChar(ctxt);
      name_00 = htmlParseName(ctxt);
      if (name_00 == (xmlChar *)0x0) {
        htmlParseErr(ctxt,XML_ERR_NAME_REQUIRED,"htmlParseEntityRef: no name\n",(xmlChar *)0x0,
                     (xmlChar *)0x0);
      }
      else {
        if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
          xmlParserInputGrow(ctxt->input,0xfa);
        }
        if (*ctxt->input->cur == ';') {
          if (str != (xmlChar **)0x0) {
            *str = name_00;
          }
          local_30 = (htmlParserCtxtPtr)htmlEntityLookup(name_00);
          if (local_30 != (htmlParserCtxtPtr)0x0) {
            xmlNextChar(ctxt);
          }
        }
        else {
          htmlParseErr(ctxt,XML_ERR_ENTITYREF_SEMICOL_MISSING,
                       "htmlParseEntityRef: expecting \';\'\n",(xmlChar *)0x0,(xmlChar *)0x0);
          if (str != (xmlChar **)0x0) {
            *str = name_00;
          }
        }
      }
    }
    ctxt_local = local_30;
  }
  return (htmlEntityDesc *)ctxt_local;
}

Assistant:

const htmlEntityDesc *
htmlParseEntityRef(htmlParserCtxtPtr ctxt, const xmlChar **str) {
    const xmlChar *name;
    const htmlEntityDesc * ent = NULL;

    if (str != NULL) *str = NULL;
    if ((ctxt == NULL) || (ctxt->input == NULL)) return(NULL);

    if (CUR == '&') {
        NEXT;
        name = htmlParseName(ctxt);
	if (name == NULL) {
	    htmlParseErr(ctxt, XML_ERR_NAME_REQUIRED,
	                 "htmlParseEntityRef: no name\n", NULL, NULL);
	} else {
	    GROW;
	    if (CUR == ';') {
	        if (str != NULL)
		    *str = name;

		/*
		 * Lookup the entity in the table.
		 */
		ent = htmlEntityLookup(name);
		if (ent != NULL) /* OK that's ugly !!! */
		    NEXT;
	    } else {
		htmlParseErr(ctxt, XML_ERR_ENTITYREF_SEMICOL_MISSING,
		             "htmlParseEntityRef: expecting ';'\n",
			     NULL, NULL);
	        if (str != NULL)
		    *str = name;
	    }
	}
    }
    return(ent);
}